

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval-typed-animatable.cc
# Opt level: O2

bool tinyusdz::tydra::EvaluateTypedAnimatableAttribute<tinyusdz::value::color4f>
               (Stage *stage,TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_> *tattr,
               string *attr_name,color4f *value_out,string *err,double t,
               TimeSampleInterpolationType tinterp)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  ostream *poVar7;
  color4f *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  ostringstream ss_e;
  TerminalAttributeValue value_1;
  allocator local_5b9;
  string *local_5b8;
  double local_5b0;
  string local_5a8;
  allocator local_588 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  string local_548;
  undefined1 local_528 [32];
  Variability VStack_508;
  undefined4 uStack_504;
  string sStack_500;
  undefined8 uStack_4ff;
  bool local_4c8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_4a0;
  AttrMetas local_488;
  TerminalAttributeValue local_280;
  
  if (value_out == (color4f *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
    poVar7 = ::std::operator<<((ostream *)local_528,"[error]");
    poVar7 = ::std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval-typed-animatable.cc"
                              );
    poVar7 = ::std::operator<<(poVar7,":");
    poVar7 = ::std::operator<<(poVar7,"EvaluateTypedAnimatableAttribute");
    poVar7 = ::std::operator<<(poVar7,"():");
    poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xd4);
    ::std::operator<<(poVar7," ");
    poVar7 = ::std::operator<<((ostream *)local_528,"`value_out` param is nullptr.");
    ::std::operator<<(poVar7,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
  }
  else if (tattr[0x268] == (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>)0x1) {
joined_r0x003f51ff:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)tinterp;
    local_5b8 = attr_name;
    local_5b0 = t;
    if (tattr[0x228] == (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>)0x1) {
      sStack_500 = (string)0x0;
      uStack_4ff = 0;
      local_528._24_8_ = (pointer)0x0;
      VStack_508 = Varying;
      uStack_504._0_1_ = false;
      uStack_504._1_3_ = 0;
      local_528._0_8_ = (pointer)0x0;
      local_528._8_8_ = 0;
      local_528[0x10] = false;
      local_528[0x11] = false;
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_out;
      bVar4 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>::get_value
                        (tattr,(Animatable<tinyusdz::value::color4f> *)local_528);
      if (bVar4) {
        bVar5 = Animatable<tinyusdz::value::color4f>::get
                          ((Animatable<tinyusdz::value::color4f> *)local_528,local_5b0,value_out,
                           tinterp);
        tattr = (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_> *)0x1;
        if (!bVar5) {
          if (err != (string *)0x0) {
            ::std::__cxx11::string::string
                      ((string *)&local_5a8,"Failed to get TypedAnimatableAttribute value: {} \n",
                       local_588);
            fmt::format<std::__cxx11::string>
                      ((string *)&local_280,(fmt *)&local_5a8,(string *)local_5b8,args);
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          tattr = (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_> *)0x0;
        }
      }
      bVar6 = (byte)tattr;
      ::std::
      _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color4f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color4f>::Sample>_>
      ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color4f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color4f>::Sample>_>
                       *)(local_528 + 0x18));
      if (bVar4) goto LAB_003f50a7;
    }
    else {
      if (*(long *)(tattr + 0x218) != *(long *)(tattr + 0x210)) {
        Attribute::Attribute((Attribute *)local_528);
        if (tattr[0x268] == (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>)0x1) {
          local_4c8 = true;
          VStack_508 = Varying;
        }
        else {
          bVar4 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>::is_value_empty
                            (tattr);
          if (((bVar4) || (*(long *)(tattr + 0x218) == *(long *)(tattr + 0x210))) ||
             (((byte)tattr[0x228] & 1) != 0)) {
            tinyusdz::value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
            ::std::__cxx11::string::_M_assign(&sStack_500);
            ::std::__cxx11::string::_M_dispose();
            VStack_508 = Varying;
          }
          else {
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&local_4a0,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(tattr + 0x210));
          }
        }
        AttrMetas::operator=(&local_488,(AttrMetas *)tattr);
        TerminalAttributeValue::TerminalAttributeValue(&local_280);
        bVar6 = EvaluateAttribute(stage,(Attribute *)local_528,local_5b8,&local_280,err,local_5b0,
                                  tinterp);
        if ((bool)bVar6) {
          pcVar8 = TerminalAttributeValue::as<tinyusdz::value::color4f>(&local_280);
          if (pcVar8 == (color4f *)0x0) {
            if (err != (string *)0x0) {
              ::std::__cxx11::string::string
                        ((string *)local_588,
                         "Type mismatch. Value producing attribute has type {}, but requested type is {}[]. Attribute: {}"
                         ,&local_5b9);
              TerminalAttributeValue::type_name_abi_cxx11_(&local_548,&local_280);
              tinyusdz::value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        (&local_5a8,(fmt *)local_588,&local_548,&local_568,local_5b8,args_2);
              ::std::__cxx11::string::append((string *)err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            TerminalAttributeValue::~TerminalAttributeValue(&local_280);
            Attribute::~Attribute((Attribute *)local_528);
            goto LAB_003f50a4;
          }
          fVar1 = pcVar8->g;
          fVar2 = pcVar8->b;
          fVar3 = pcVar8->a;
          value_out->r = pcVar8->r;
          value_out->g = fVar1;
          value_out->b = fVar2;
          value_out->a = fVar3;
        }
        TerminalAttributeValue::~TerminalAttributeValue(&local_280);
        Attribute::~Attribute((Attribute *)local_528);
        goto LAB_003f50a7;
      }
      bVar4 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>::is_value_empty(tattr)
      ;
      if (bVar4) goto joined_r0x003f51ff;
      if (err != (string *)0x0) {
        ::std::__cxx11::string::string
                  ((string *)&local_280,"[Internal error] Invalid TypedAttribute? : {} \n",
                   (allocator *)&local_5a8);
        fmt::format<std::__cxx11::string>
                  ((string *)local_528,(fmt *)&local_280,(string *)attr_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_out);
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
    }
  }
LAB_003f50a4:
  bVar6 = 0;
LAB_003f50a7:
  return (bool)(bVar6 & 1);
}

Assistant:

bool EvaluateTypedAnimatableAttribute(
    const tinyusdz::Stage &stage, const TypedAttribute<Animatable<T>> &tattr,
    const std::string &attr_name,
    T *value_out,
    std::string *err,
    const double t,
    const value::TimeSampleInterpolationType tinterp) {

  if (!value_out) {
    PUSH_ERROR_AND_RETURN("`value_out` param is nullptr.");
  }

  // Eval order:
  // - ValueBlocked?
  // - has value?(default value or timesamped value)
  // - has connection?

  if (tattr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is Blocked.\n";
    }
    return false;
  } else if (tattr.has_value()) {
    Animatable<T> value;
    if (tattr.get_value(&value)) {
      if (value.get(t, value_out, tinterp)) {
        return true;
      } else {
        if (err) {
          (*err) += fmt::format("Failed to get TypedAnimatableAttribute value: {} \n", attr_name);
        }
        return false;
      }
    }
  } else if (tattr.has_connections()) {

    // Follow targetPath
    Attribute attr = ToAttributeConnection(tattr);

    TerminalAttributeValue value;
    bool ret = EvaluateAttribute(stage, attr, attr_name, &value, err,
                                 t, tinterp);

    if (!ret) {
      return false;
    }

    if (auto pv = value.as<T>()) {
      (*value_out) = *pv;
      return true;
    }

    if (err) {
      (*err) += fmt::format("Type mismatch. Value producing attribute has type {}, but requested type is {}[]. Attribute: {}", value.type_name(), value::TypeTraits<T>::type_name(), attr_name);
    }

  } else if (tattr.is_value_empty()) {
    if (err) {
      (*err) += "Attribute value is empty.\n";
    }
    return false;
  } else {
    if (err) {
      (*err) += fmt::format("[Internal error] Invalid TypedAttribute? : {} \n", attr_name);
    }
  }
  return false;
}